

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void xmlListReverseWalk(xmlListPtr l,xmlListWalker walker,void *user)

{
  int iVar1;
  xmlLinkPtr pxVar2;
  
  if (walker != (xmlListWalker)0x0 && l != (xmlListPtr)0x0) {
    pxVar2 = l->sentinel;
    do {
      pxVar2 = pxVar2->prev;
      if (pxVar2 == l->sentinel) {
        return;
      }
      iVar1 = (*walker)(pxVar2->data,user);
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void
xmlListReverseWalk(xmlListPtr l, xmlListWalker walker, void *user) {
    xmlLinkPtr lk;

    if ((l == NULL) || (walker == NULL))
        return;
    for(lk = l->sentinel->prev; lk != l->sentinel; lk = lk->prev) {
        if((walker(lk->data, user)) == 0)
                break;
    }
}